

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.cpp
# Opt level: O1

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::StoreLPJointObservation::Store
          (StoreLPJointObservation *this)

{
  ParserPOMDPFormat_Spirit *pPVar1;
  pointer puVar2;
  iterator __position;
  undefined8 *puVar3;
  stringstream msg;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b0;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  pPVar1 = this->_m_po;
  puVar2 = (pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  if (this->_m_isJointObservationIndex == true) {
    puVar2 = (pPVar1->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pPVar1->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (pPVar1->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    if (pPVar1->_m_lp_type != UINT) {
      std::__cxx11::stringstream::stringstream(local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_188,
                 "StoreLPJointObservation::Store() requires that last parsed element is a UINT! (last parsed index was a joint action index)"
                 ,0x7a);
      std::endl<char,std::char_traits<char>>(local_188);
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
      *puVar3 = &PTR__E_0059bd80;
      std::__cxx11::stringbuf::str();
      *puVar3 = &PTR__E_005ce150;
      __cxa_throw(puVar3,&EParse::typeinfo,E::~E);
    }
    __position._M_current =
         (pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar1->_m_lp_JOI,__position,
                 &pPVar1->_m_lp_uint);
      return;
    }
    *__position._M_current = pPVar1->_m_lp_uint;
    (pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1b0,&pPVar1->_m_lp_JO);
    MatchingJointObservations(this,0,&local_1b0);
    if (local_1b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1b0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pPVar1 = this->_m_po;
    puVar2 = (pPVar1->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pPVar1->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (pPVar1->_m_lp_JO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
  }
  return;
}

Assistant:

void ParserPOMDPFormat_Spirit::StoreLPJointObservation::Store() const
{
    _m_po->_m_lp_JOI.clear();
    if(_m_isJointObservationIndex) //as opposed to parsing individual indices
    {
        //_m_lp_JO not necessary: clear it.
        _m_po->_m_lp_JO.clear();
        //do check that the last parsed element was a index (uint)
        if (_m_po->_m_lp_type != UINT)
        {
            stringstream msg;
            msg << "StoreLPJointObservation::Store() requires that last parsed element is a UINT! (last parsed index was a joint action index)"<< endl;
            throw EParse(msg);
        }
        _m_po->_m_lp_JOI.push_back(_m_po->_m_lp_uint);
        return;
    }
    MatchingJointObservations(0,_m_po->_m_lp_JO); 
    _m_po->_m_lp_JO.clear();
}